

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O3

void __thiscall sjtu::UserManager::add_user(UserManager *this,int argc,string *argv)

{
  string *psVar1;
  UserManager *pUVar2;
  int iVar3;
  undefined1 *puVar4;
  int *piVar5;
  undefined4 extraout_var_00;
  char *pcVar6;
  long *plVar7;
  undefined8 uVar8;
  undefined1 *in_RCX;
  long lVar9;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar10;
  ulong uVar11;
  value_type *pvVar12;
  int *__dest;
  long lVar13;
  int iVar14;
  string *psVar15;
  pair<long,_bool> pVar16;
  string usname;
  string current;
  string uspass;
  string umail;
  string uname;
  allocator local_191;
  int *local_190;
  int *local_188;
  long *local_180;
  UserManager *local_178;
  char *local_170;
  undefined1 local_168;
  value_type local_160;
  char local_150;
  undefined7 uStack_14f;
  value_type local_140;
  undefined1 local_130;
  undefined7 uStack_12f;
  value_type local_120;
  char local_110;
  undefined7 uStack_10f;
  value_type local_100;
  char local_f0;
  undefined7 uStack_ef;
  value_type local_e0;
  char local_d0;
  undefined7 uStack_cf;
  long *local_c0;
  long local_b8;
  long local_b0 [2];
  long *local_a0;
  long local_98;
  long local_90 [2];
  long *local_80;
  long local_78;
  long local_70 [2];
  long *local_60;
  long local_58;
  long local_50 [2];
  value_type local_40;
  undefined4 extraout_var;
  undefined4 extraout_var_01;
  
  pBVar10 = this->UserBpTree;
  if (pBVar10->root == -1) {
    local_178 = this;
    iVar14 = (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[1])()
    ;
    piVar5 = (int *)CONCAT44(extraout_var,iVar14);
    local_180 = (long *)(piVar5 + 0x1e);
    *(undefined8 *)(piVar5 + 0x1e) = extraout_RDX;
    piVar5[0x1a] = 10;
    if (0 < argc) {
      local_188 = (int *)((long)piVar5 + 0x49);
      local_190 = piVar5 + 0xd;
      iVar14 = 0;
      do {
        iVar3 = std::__cxx11::string::compare((char *)argv);
        __dest = piVar5;
        if ((((iVar3 == 0) ||
             (iVar3 = std::__cxx11::string::compare((char *)argv),
             __dest = (int *)((long)piVar5 + 0x15), iVar3 == 0)) ||
            (iVar3 = std::__cxx11::string::compare((char *)argv), __dest = local_190, iVar3 == 0))
           || (iVar3 = std::__cxx11::string::compare((char *)argv), __dest = local_188, iVar3 == 0))
        {
          strcpy((char *)__dest,argv[1]._M_dataplus._M_p);
        }
        argv = argv + 2;
        iVar14 = iVar14 + 2;
      } while (iVar14 < argc);
    }
    pUVar2 = local_178;
    plVar7 = local_180;
    piVar5[0x1b] = 0;
    (*(local_178->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[3])
              (local_178->UserFile,local_180);
    pBVar10 = pUVar2->UserBpTree;
    std::__cxx11::string::string((string *)&local_60,(char *)piVar5,(allocator *)&local_120);
    if (local_58 == 0) {
      local_160.first = 0;
    }
    else {
      lVar13 = 0;
      lVar9 = 0;
      uVar11 = 0;
      do {
        lVar9 = ((long)*(char *)((long)local_60 + lVar13) + lVar9 * 0x239 + 0x100) % 0x3b800001;
        uVar11 = (long)((long)*(char *)((long)local_60 + lVar13) + uVar11 * 0x301 + 0x100) %
                 0x3b9aca07;
        lVar13 = lVar13 + 1;
      } while (local_58 != lVar13);
      local_160.first = lVar9 << 0x20 | uVar11;
    }
    local_160.second = *plVar7;
    BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::insert
              (pBVar10,&local_160);
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
    plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    return;
  }
  local_160.first = (unsigned_long_long)&local_150;
  iVar14 = 0;
  local_160.second = 0;
  local_150 = '\0';
  local_120.first = (unsigned_long_long)&local_110;
  local_120.second = 0;
  local_110 = '\0';
  local_e0.first = (unsigned_long_long)&local_d0;
  local_e0.second = 0;
  local_d0 = '\0';
  local_100.first = (unsigned_long_long)&local_f0;
  local_100.second = 0;
  local_f0 = '\0';
  local_190 = (int *)&local_130;
  local_140.second = 0;
  local_130 = 0;
  piVar5 = (int *)in_RCX;
  local_140.first = (unsigned_long_long)local_190;
  if (0 < argc) {
    psVar15 = argv + 1;
    local_178 = this;
    do {
      psVar1 = psVar15 + -1;
      iVar3 = std::__cxx11::string::compare((char *)psVar1);
      pvVar12 = &local_160;
      if (iVar3 == 0) {
LAB_00105079:
        std::__cxx11::string::_M_assign((string *)pvVar12);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)psVar1);
        pvVar12 = &local_120;
        if (iVar3 == 0) goto LAB_00105079;
        iVar3 = std::__cxx11::string::compare((char *)psVar1);
        pvVar12 = &local_e0;
        if (iVar3 == 0) goto LAB_00105079;
        iVar3 = std::__cxx11::string::compare((char *)psVar1);
        pvVar12 = &local_100;
        if (iVar3 == 0) goto LAB_00105079;
        iVar3 = std::__cxx11::string::compare((char *)psVar1);
        pvVar12 = &local_140;
        if (iVar3 == 0) goto LAB_00105079;
        iVar3 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar3 == 0) {
          pcVar6 = (psVar15->_M_dataplus)._M_p;
          local_188 = __errno_location();
          local_180 = (long *)CONCAT44(local_180._4_4_,*local_188);
          *local_188 = 0;
          puVar4 = (undefined1 *)strtol(pcVar6,&local_170,10);
          if (local_170 == pcVar6) {
LAB_00105827:
            uVar8 = std::__throw_invalid_argument("stoi");
            if (local_80 != local_70) {
              operator_delete(local_80,local_70[0] + 1);
            }
            if ((undefined1 *)local_140.first != &local_130) {
              operator_delete((void *)local_140.first,CONCAT71(uStack_12f,local_130) + 1);
            }
            if ((char *)local_100.first != &local_f0) {
              operator_delete((void *)local_100.first,CONCAT71(uStack_ef,local_f0) + 1);
            }
            if ((char *)local_e0.first != &local_d0) {
              operator_delete((void *)local_e0.first,CONCAT71(uStack_cf,local_d0) + 1);
            }
            if ((char *)local_120.first != &local_110) {
              operator_delete((void *)local_120.first,CONCAT71(uStack_10f,local_110) + 1);
            }
            if ((char *)local_160.first != &local_150) {
              operator_delete((void *)local_160.first,CONCAT71(uStack_14f,local_150) + 1);
            }
            _Unwind_Resume(uVar8);
          }
          local_190 = (int *)puVar4;
          if (((undefined1 *)(long)(int)puVar4 != puVar4) || (*local_188 == 0x22)) {
            std::__throw_out_of_range("stoi");
            goto LAB_00105827;
          }
          if (*local_188 == 0) {
            *local_188 = (int)local_180;
          }
        }
      }
      psVar15 = psVar15 + 2;
      iVar14 = iVar14 + 2;
    } while (iVar14 < argc);
    pBVar10 = local_178->UserBpTree;
    this = local_178;
    piVar5 = local_190;
  }
  local_190 = piVar5;
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,local_140.first,(undefined1 *)(local_140.first + local_140.second))
  ;
  if (local_98 == 0) {
    local_40.first = 0;
  }
  else {
    lVar13 = 0;
    lVar9 = 0;
    local_40.first = 0;
    do {
      lVar9 = ((long)*(char *)((long)local_a0 + lVar13) + lVar9 * 0x239 + 0x100) % 0x3b800001;
      local_40.first =
           (long)((long)*(char *)((long)local_a0 + lVar13) + local_40.first * 0x301 + 0x100) %
           0x3b9aca07;
      lVar13 = lVar13 + 1;
    } while (local_98 != lVar13);
    local_40.first = lVar9 << 0x20 | local_40.first;
  }
  pVar16 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     (pBVar10,&local_40.first);
  local_170 = (char *)pVar16.first;
  local_168 = pVar16.second;
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
    pVar16.second = (bool)local_168;
    pVar16.first = (long)local_170;
    pVar16._9_7_ = 0;
  }
  local_170 = (char *)pVar16.first;
  if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
  }
  else {
    iVar14 = (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[2])
                       (this->UserFile,&local_170);
    if ((*(uint *)(CONCAT44(extraout_var_00,iVar14) + 0x6c) == this->online_flag) &&
       ((int)local_190 < *(int *)(CONCAT44(extraout_var_00,iVar14) + 0x68))) {
      pBVar10 = this->UserBpTree;
      local_c0 = local_b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,local_160.first,(char *)(local_160.first + local_160.second));
      if (local_b8 == 0) {
        local_40.first = 0;
      }
      else {
        lVar13 = 0;
        lVar9 = 0;
        local_40.first = 0;
        do {
          lVar9 = ((long)*(char *)((long)local_c0 + lVar13) + lVar9 * 0x239 + 0x100) % 0x3b800001;
          local_40.first =
               (long)((long)*(char *)((long)local_c0 + lVar13) + local_40.first * 0x301 + 0x100) %
               0x3b9aca07;
          lVar13 = lVar13 + 1;
        } while (local_b8 != lVar13);
        local_40.first = lVar9 << 0x20 | local_40.first;
      }
      pVar16 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                         (pBVar10,&local_40.first);
      if (local_c0 != local_b0) {
        operator_delete(local_c0,local_b0[0] + 1);
      }
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        iVar14 = (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base
                   [1])();
        pcVar6 = (char *)CONCAT44(extraout_var_01,iVar14);
        *(undefined8 *)(pcVar6 + 0x78) = extraout_RDX_00;
        strcpy(pcVar6,(char *)local_160.first);
        strcpy(pcVar6 + 0x15,(char *)local_120.first);
        strcpy(pcVar6 + 0x34,(char *)local_e0.first);
        strcpy(pcVar6 + 0x49,(char *)local_100.first);
        *(int *)(pcVar6 + 0x68) = (int)local_190;
        pcVar6[0x6c] = '\0';
        pcVar6[0x6d] = '\0';
        pcVar6[0x6e] = '\0';
        pcVar6[0x6f] = '\0';
        (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[3])
                  (this->UserFile,pcVar6 + 0x78);
        pBVar10 = this->UserBpTree;
        std::__cxx11::string::string((string *)&local_80,pcVar6,&local_191);
        if (local_78 == 0) {
          local_40.first = 0;
        }
        else {
          lVar13 = 0;
          lVar9 = 0;
          local_40.first = 0;
          do {
            lVar9 = ((long)*(char *)((long)local_80 + lVar13) + lVar9 * 0x239 + 0x100) % 0x3b800001;
            local_40.first =
                 (long)((long)*(char *)((long)local_80 + lVar13) + local_40.first * 0x301 + 0x100) %
                 0x3b9aca07;
            lVar13 = lVar13 + 1;
          } while (local_78 != lVar13);
          local_40.first = lVar9 << 0x20 | local_40.first;
        }
        local_40.second = *(long *)(pcVar6 + 0x78);
        BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::insert
                  (pBVar10,&local_40);
        if (local_80 != local_70) {
          operator_delete(local_80,local_70[0] + 1);
        }
        plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
        std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
        std::ostream::put((char)plVar7);
        std::ostream::flush();
        goto LAB_001056f5;
      }
    }
    plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
  }
LAB_001056f5:
  if ((undefined1 *)local_140.first != &local_130) {
    operator_delete((void *)local_140.first,CONCAT71(uStack_12f,local_130) + 1);
  }
  if ((char *)local_100.first != &local_f0) {
    operator_delete((void *)local_100.first,CONCAT71(uStack_ef,local_f0) + 1);
  }
  if ((char *)local_e0.first != &local_d0) {
    operator_delete((void *)local_e0.first,CONCAT71(uStack_cf,local_d0) + 1);
  }
  if ((char *)local_120.first != &local_110) {
    operator_delete((void *)local_120.first,CONCAT71(uStack_10f,local_110) + 1);
  }
  if ((char *)local_160.first != &local_150) {
    operator_delete((void *)local_160.first,CONCAT71(uStack_14f,local_150) + 1);
  }
  return;
}

Assistant:

void add_user(int argc, std::string *argv) {
            if (UserBpTree->empty()) {
                auto ret = UserFile->newspace();
                userType *user = ret.first;
                user->offset = ret.second;
                user->privilege = 10;
                for (int i = 0; i < argc; i += 2) {
                    if (argv[i] == "-u") strcpy(user->username, argv[i + 1].c_str());
                    else if (argv[i] == "-p") strcpy(user->password, argv[i + 1].c_str());
                    else if (argv[i] == "-n") strcpy(user->name, argv[i + 1].c_str());
                    else if (argv[i] == "-m") strcpy(user->mailAddr, argv[i + 1].c_str());
                }
                user->is_online = 0;
                UserFile->save(user->offset);
                UserBpTree->insert(BplusTree<StringHasher::hashType , locType>::value_type(hasher(user->username), user->offset));
                std::cout << 0 << std::endl;
            } else {
                std::string usname, uspass, uname, umail, current;
                int upri;
                for (int i = 0; i < argc; i += 2) {
                    if (argv[i] == "-u") usname = argv[i + 1];
                    else if (argv[i] == "-p") uspass = argv[i + 1];
                    else if (argv[i] == "-n") uname = argv[i + 1];
                    else if (argv[i] == "-m") umail = argv[i + 1];
                    else if (argv[i] == "-c") current = argv[i + 1];
                    else if (argv[i] == "-g") upri = stoi(argv[i + 1]);
                }
                std::pair<locType, bool> tmp = UserBpTree->find(hasher(current));
                if (tmp.second)
		{
			userType *curuser = UserFile->read(tmp.first);
			if (curuser -> is_online == online_flag && curuser->privilege > upri && UserBpTree -> find(hasher(usname)).second == false)
			{
				auto ret = UserFile -> newspace();
				userType *user = ret . first;
				user -> offset = ret . second;
				strcpy(user -> username , usname . c_str());
				strcpy(user -> password , uspass . c_str());
				strcpy(user -> name , uname . c_str());
				strcpy(user -> mailAddr , umail . c_str());
				user -> privilege = upri;
				user -> is_online = 0;
				UserFile -> save(user -> offset);
				UserBpTree -> insert(BplusTree<StringHasher::hashType , locType>::value_type(
					hasher(user -> username) , user -> offset));
				std::cout << 0 << std::endl;
			}else std::cout << -1 << std::endl;
                } else std::cout << -1 << std::endl;
            }
        }